

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.c
# Opt level: O3

void test_parse_cold_40(void)

{
  FILE *__stream;
  uint uVar1;
  milo_value *in_RDI;
  
  __stream = _stderr;
  uVar1 = milo_parse(in_RDI,"[ null , false , true , 123 , \"abc\" ]");
  fprintf(__stream,"%s:%d: expect: %d actual: %d\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/KevinOfNeu[P]Milo/test.c",0x90,0,
          (ulong)uVar1);
  main_ret = 1;
  return;
}

Assistant:

static void test_parse_array() {
    size_t i, j;
    milo_value v;

    milo_init(&v);
    EXPECT_EQ_INT(MILO_PARSE_OK, milo_parse(&v, "[ ]"));
    EXPECT_EQ_INT(MILO_ARRAY, milo_get_type(&v));
    EXPECT_EQ_SIZE_T(0, milo_get_array_size(&v));
    milo_free(&v);

    milo_init(&v);
    EXPECT_EQ_INT(MILO_PARSE_OK, milo_parse(&v, "[ null , false , true , 123 , \"abc\" ]"));
    EXPECT_EQ_INT(MILO_ARRAY, milo_get_type(&v));
    EXPECT_EQ_SIZE_T(5, milo_get_array_size(&v));
    EXPECT_EQ_INT(MILO_NULL,   milo_get_type(milo_get_array_element(&v, 0)));
    EXPECT_EQ_INT(MILO_FALSE,  milo_get_type(milo_get_array_element(&v, 1)));
    EXPECT_EQ_INT(MILO_TRUE,   milo_get_type(milo_get_array_element(&v, 2)));
    EXPECT_EQ_INT(MILO_NUMBER, milo_get_type(milo_get_array_element(&v, 3)));
    EXPECT_EQ_INT(MILO_STRING, milo_get_type(milo_get_array_element(&v, 4)));
    EXPECT_EQ_DOUBLE(123.0, milo_get_number(milo_get_array_element(&v, 3)));
    EXPECT_EQ_STRING("abc", milo_get_string(milo_get_array_element(&v, 4)), milo_get_string_length(milo_get_array_element(&v, 4)));
    milo_free(&v);

    milo_init(&v);
    EXPECT_EQ_INT(MILO_PARSE_OK, milo_parse(&v, "[ [ ] , [ 0 ] , [ 0 , 1 ] , [ 0 , 1 , 2 ] ]"));
    EXPECT_EQ_INT(MILO_ARRAY, milo_get_type(&v));
    EXPECT_EQ_SIZE_T(4, milo_get_array_size(&v));
    for (i = 0; i < 4; i++) {
        milo_value* a = milo_get_array_element(&v, i);
        EXPECT_EQ_INT(MILO_ARRAY, milo_get_type(a));
        EXPECT_EQ_SIZE_T(i, milo_get_array_size(a));
        for (j = 0; j < i; j++) {
            milo_value* e = milo_get_array_element(a, j);
            EXPECT_EQ_INT(MILO_NUMBER, milo_get_type(e));
            EXPECT_EQ_DOUBLE((double)j, milo_get_number(e));
        }
    }
    milo_free(&v);
}